

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O2

void __thiscall
TidyConfigParser::setCheckConfig
          (TidyConfigParser *this,string *configName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configValues)

{
  string *psVar1;
  bool bVar2;
  invalid_argument *this_00;
  undefined8 extraout_RAX;
  long *plVar3;
  char *__s;
  int extraout_EDX;
  char unaff_BPL;
  long lVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  allocator<char> local_a1;
  TidyConfigParser *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_98;
  string *local_90;
  string local_88;
  string local_68;
  string local_48;
  
  local_a0 = this;
  local_98 = configValues;
  local_90 = configName;
  bVar2 = std::operator==(configName,"clkName");
  lVar4 = 0x1f8;
  if (!bVar2) {
    bVar2 = std::operator==(configName,"resetName");
    lVar4 = 600;
    if (!bVar2) {
      bVar2 = std::operator==(configName,"clkNameRegexString");
      if (bVar2) {
        psVar1 = &(this->config).checkConfigs.clkNameRegexString;
        setCheckConfig(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)
        ::$_0::operator()((__0 *)&local_a0,psVar1);
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_88,psVar1,0x10);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::operator=
                  (&(this->config).checkConfigs.clkNameRegexPattern,
                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_88);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_88);
        return;
      }
      bVar2 = std::operator==(configName,"resetIsActiveHigh");
      if (bVar2) {
        psVar1 = (configValues->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar4 = (long)(configValues->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)psVar1;
        if (lVar4 == 0x20) {
          parseConfigValue(this,&(this->config).checkConfigs.resetIsActiveHigh,psVar1);
          return;
        }
        local_88.field_2._M_allocated_capacity = lVar4 >> 5;
        local_88._M_dataplus._M_p = (configName->_M_dataplus)._M_p;
        local_88._M_string_length = configName->_M_string_length;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)&local_88;
        fmt_00.size_ = 0x4d;
        fmt_00.data_ = (char *)0x34;
        ::fmt::v11::vformat_abi_cxx11_
                  (&local_68,(v11 *)"Expected one configuration value for \'{}\' but got {}",fmt_00,
                   args_00);
        reportErrorAndExit(this,&local_68);
        std::__cxx11::string::~string((string *)&local_88);
        if (unaff_BPL != '\0') {
          __cxa_free_exception(configValues);
        }
        if (extraout_EDX == 1) {
          plVar3 = (long *)__cxa_begin_catch(extraout_RAX);
          __s = (char *)(**(code **)(*plVar3 + 0x10))(plVar3);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_a1);
          reportWarning(this,&local_48);
          std::__cxx11::string::~string((string *)&local_48);
          __cxa_end_catch();
          return;
        }
        _Unwind_Resume(extraout_RAX);
      }
      bVar2 = std::operator==(configName,"inputPortSuffix");
      lVar4 = 0x280;
      if (!bVar2) {
        bVar2 = std::operator==(configName,"outputPortSuffix");
        lVar4 = 0x298;
        if (!bVar2) {
          bVar2 = std::operator==(configName,"inoutPortSuffix");
          lVar4 = 0x2b0;
          if (!bVar2) {
            bVar2 = std::operator==(configName,"moduleInstantiationPrefix");
            lVar4 = 0x2c8;
            if (!bVar2) {
              this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
              local_68._M_dataplus._M_p = (configName->_M_dataplus)._M_p;
              local_68._M_string_length = configName->_M_string_length;
              args.field_1.args_ = in_R9.args_;
              args.desc_ = (unsigned_long_long)&local_68;
              fmt.size_ = 0xd;
              fmt.data_ = (char *)0x1c;
              ::fmt::v11::vformat_abi_cxx11_
                        (&local_88,(v11 *)"The check: {} does not exist",fmt,args);
              std::invalid_argument::invalid_argument(this_00,(string *)&local_88);
              __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            goto LAB_0018c175;
          }
        }
      }
      setCheckConfig(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)
      ::$_0::operator()((__0 *)&local_a0,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&(this->keywords)._M_h._M_buckets + lVar4));
      return;
    }
  }
LAB_0018c175:
  setCheckConfig(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)
  ::$_0::operator()((__0 *)&local_a0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&(this->keywords)._M_h._M_buckets + lVar4));
  return;
}

Assistant:

void TidyConfigParser::setCheckConfig(const std::string& configName,
                                      std::vector<std::string> configValues) {
    SLANG_TRY {
        config.visitConfig(configName, [&](auto& v) {
            if constexpr (is_vector_v<std::remove_cvref_t<decltype(v)>>) {
                parseConfigValue(v, std::move(configValues));
            }
            else {
                if (configValues.size() != 1) {
                    reportErrorAndExit(
                        fmt::format("Expected one configuration value for '{}' but got {}",
                                    configName, configValues.size()));
                }
                parseConfigValue(v, std::move(configValues.front()));
            }
        });
    }